

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_value.cpp
# Opt level: O1

void __thiscall Json::Path::makePath(Path *this,String *path,InArgs *in)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  byte bVar2;
  value_type *pvVar3;
  void *pvVar4;
  byte *pbVar5;
  pointer ppPVar6;
  byte *pbVar7;
  byte *pbVar8;
  PathArgument local_80;
  InArgs *local_58;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_50;
  size_type local_48;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_40;
  
  if (path->_M_string_length != 0) {
    pbVar7 = (byte *)(path->_M_dataplus)._M_p;
    pbVar5 = pbVar7 + path->_M_string_length;
    ppPVar6 = (in->
              super__Vector_base<const_Json::PathArgument_*,_std::allocator<const_Json::PathArgument_*>_>
              )._M_impl.super__Vector_impl_data._M_start;
    local_58 = in;
    do {
      bVar2 = *pbVar7;
      pbVar8 = pbVar7;
      if (bVar2 < 0x5b) {
        if (bVar2 == 0x25) {
          if ((ppPVar6 !=
               (local_58->
               super__Vector_base<const_Json::PathArgument_*,_std::allocator<const_Json::PathArgument_*>_>
               )._M_impl.super__Vector_impl_data._M_finish) &&
             (pvVar3 = *ppPVar6, pvVar3->kind_ == kindKey)) {
            ppPVar6 = ppPVar6 + 1;
            std::vector<Json::PathArgument,_std::allocator<Json::PathArgument>_>::push_back
                      (&this->args_,pvVar3);
          }
        }
        else if (bVar2 != 0x2e) {
joined_r0x00135117:
          while ((pbVar8 != pbVar5 &&
                 (pvVar4 = memchr("[.",(int)(char)*pbVar8,3), pvVar4 == (void *)0x0))) {
            pbVar8 = pbVar8 + 1;
          }
          local_50 = &local_40;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,pbVar7,pbVar8);
          paVar1 = &local_80.key_.field_2;
          if (local_50 == &local_40) {
            local_80.key_.field_2._8_8_ = local_40._8_8_;
            local_80.key_._M_dataplus._M_p = (pointer)paVar1;
          }
          else {
            local_80.key_._M_dataplus._M_p = (pointer)local_50;
          }
          local_80.key_.field_2._M_allocated_capacity._1_7_ = local_40._M_allocated_capacity._1_7_;
          local_80.key_.field_2._M_local_buf[0] = local_40._M_local_buf[0];
          local_80.key_._M_string_length = local_48;
          local_48 = 0;
          local_40._M_local_buf[0] = '\0';
          local_80.index_ = 0;
          local_80.kind_ = kindKey;
          local_50 = &local_40;
          std::vector<Json::PathArgument,_std::allocator<Json::PathArgument>_>::
          emplace_back<Json::PathArgument>(&this->args_,&local_80);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_80.key_._M_dataplus._M_p != paVar1) {
            operator_delete(local_80.key_._M_dataplus._M_p,
                            local_80.key_.field_2._M_allocated_capacity + 1);
          }
          if (local_50 != &local_40) {
            operator_delete(local_50,CONCAT71(local_40._M_allocated_capacity._1_7_,
                                              local_40._M_local_buf[0]) + 1);
          }
          goto LAB_001352da;
        }
LAB_0013519a:
        pbVar8 = pbVar7 + 1;
      }
      else {
        if (bVar2 != 0x5b) {
          if (bVar2 != 0x5d) goto joined_r0x00135117;
          goto LAB_0013519a;
        }
        pbVar8 = pbVar7 + 1;
        if (pbVar7[1] == 0x25) {
          if ((ppPVar6 !=
               (local_58->
               super__Vector_base<const_Json::PathArgument_*,_std::allocator<const_Json::PathArgument_*>_>
               )._M_impl.super__Vector_impl_data._M_finish) &&
             (pvVar3 = *ppPVar6, pvVar3->kind_ == kindIndex)) {
            ppPVar6 = ppPVar6 + 1;
            std::vector<Json::PathArgument,_std::allocator<Json::PathArgument>_>::push_back
                      (&this->args_,pvVar3);
          }
        }
        else {
          paVar1 = &local_80.key_.field_2;
          if (pbVar8 == pbVar5) {
            local_80.index_ = 0;
          }
          else {
            local_80.index_ = 0;
            do {
              if (9 < (byte)(*pbVar8 - 0x30)) break;
              local_80.index_ = (uint)(byte)(*pbVar8 - 0x30) + local_80.index_ * 10;
              pbVar8 = pbVar8 + 1;
            } while (pbVar8 != pbVar5);
          }
          local_80.key_._M_string_length = 0;
          local_80.key_.field_2._M_allocated_capacity =
               local_80.key_.field_2._M_allocated_capacity & 0xffffffffffffff00;
          local_80.kind_ = kindIndex;
          local_80.key_._M_dataplus._M_p = (pointer)paVar1;
          std::vector<Json::PathArgument,_std::allocator<Json::PathArgument>_>::
          emplace_back<Json::PathArgument>(&this->args_,&local_80);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_80.key_._M_dataplus._M_p != paVar1) {
            operator_delete(local_80.key_._M_dataplus._M_p,
                            local_80.key_.field_2._M_allocated_capacity + 1);
          }
        }
        pbVar8 = pbVar8 + (pbVar8 != pbVar5);
      }
LAB_001352da:
      pbVar7 = pbVar8;
    } while (pbVar8 != pbVar5);
  }
  return;
}

Assistant:

void Path::makePath(const String& path, const InArgs& in) {
  const char* current = path.c_str();
  const char* end = current + path.length();
  auto itInArg = in.begin();
  while (current != end) {
    if (*current == '[') {
      ++current;
      if (*current == '%')
        addPathInArg(path, in, itInArg, PathArgument::kindIndex);
      else {
        ArrayIndex index = 0;
        for (; current != end && *current >= '0' && *current <= '9'; ++current)
          index = index * 10 + ArrayIndex(*current - '0');
        args_.push_back(index);
      }
      if (current == end || *++current != ']')
        invalidPath(path, int(current - path.c_str()));
    } else if (*current == '%') {
      addPathInArg(path, in, itInArg, PathArgument::kindKey);
      ++current;
    } else if (*current == '.' || *current == ']') {
      ++current;
    } else {
      const char* beginName = current;
      while (current != end && !strchr("[.", *current))
        ++current;
      args_.push_back(String(beginName, current));
    }
  }
}